

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_parseSettingsLine
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *line,int lineNumber)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  SPxOut *pSVar4;
  long lVar5;
  unsigned_long uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  Verbosity old_verbosity_7;
  char *pcVar10;
  ostream *poVar11;
  Verbosity old_verbosity_5;
  byte *pbVar12;
  byte *pbVar13;
  undefined8 *puVar14;
  Verbosity old_verbosity;
  Verbosity VVar15;
  byte *__s1_00;
  byte *pbVar16;
  Verbosity old_verbosity_2;
  byte *__s1_01;
  double value;
  string local_58;
  double local_38;
  
  for (pbVar13 = (byte *)(line + 1); uVar8 = (ulong)pbVar13[-1], uVar8 < 0x24; pbVar13 = pbVar13 + 1
      ) {
    if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
        return true;
      }
      break;
    }
  }
  __s1 = pbVar13 + -1;
  __s1_00 = pbVar13;
  do {
    if ((byte)uVar8 < 0x3b) {
      if ((0x900002601U >> (uVar8 & 0x3f) & 1) != 0) {
        __s1_00[-1] = 0;
        pbVar16 = __s1_00;
        goto LAB_003458a0;
      }
      if (uVar8 == 0x3a) break;
    }
    uVar8 = (ulong)*__s1_00;
    __s1_00 = __s1_00 + 1;
  } while( true );
  __s1_00[-1] = 0;
LAB_003458f8:
  do {
    uVar8 = (ulong)*__s1_00;
    pbVar16 = __s1_00;
    if (0x23 < uVar8) break;
    if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        poVar11 = (this->spxout).m_streams[3];
        pcVar10 = "Error parsing settings file: no parameter name in line ";
        lVar9 = 0x37;
        goto LAB_00345941;
      }
      break;
    }
    __s1_00 = __s1_00 + 1;
  } while( true );
LAB_0034598d:
  __s1_01 = pbVar16 + 1;
  if ((byte)uVar8 < 0x3e) {
    if ((0x900002601U >> (uVar8 & 0x3f) & 1) != 0) {
      *pbVar16 = 0;
      pbVar16 = __s1_01;
      goto LAB_003459ae;
    }
    if (uVar8 == 0x3d) goto LAB_003459ef;
  }
  uVar8 = (ulong)*__s1_01;
  pbVar16 = __s1_01;
  goto LAB_0034598d;
LAB_003459ef:
  *pbVar16 = 0;
LAB_003459f9:
  do {
    uVar8 = (ulong)*__s1_01;
    pbVar16 = __s1_01;
    if (0x23 < uVar8) break;
    if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        pSVar4 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar10 = "Error parsing settings file: no parameter value in line ";
        goto LAB_00345a39;
      }
      break;
    }
    __s1_01 = __s1_01 + 1;
  } while( true );
LAB_00345a79:
  pbVar12 = pbVar16 + 1;
  if ((byte)uVar8 < 0x24) {
    if ((0x900002600U >> (uVar8 & 0x3f) & 1) != 0) {
      *pbVar16 = 0;
      goto LAB_00345a9b;
    }
    if (uVar8 == 0) goto LAB_00345ac9;
  }
  uVar8 = (ulong)*pbVar12;
  pbVar16 = pbVar12;
  goto LAB_00345a79;
LAB_00345a9b:
  uVar8 = (ulong)*pbVar12;
  if (0x23 < uVar8) goto LAB_00345bdb;
  if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_00345ac9;
    goto LAB_00345bdb;
  }
  pbVar12 = pbVar12 + 1;
  goto LAB_00345a9b;
LAB_00345bdb:
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: additional character \'");
  local_58._M_dataplus._M_p._0_1_ = *pbVar12;
  std::__ostream_insert<char,std::char_traits<char>>
            (pSVar4->m_streams[pSVar4->m_verbosity],(char *)&local_58,1);
  pcVar10 = "\' after parameter value in line ";
  goto LAB_00345a39;
LAB_00345ac9:
  iVar3 = strncmp((char *)__s1,"bool",4);
  if (iVar3 == 0) {
    puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::boolParam;
    lVar9 = 0;
    do {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
      if (iVar3 == 0) {
        iVar3 = strncasecmp((char *)__s1_01,"true",4);
        if ((((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"TRUE",4), iVar3 == 0)) ||
            (iVar3 = strncasecmp((char *)__s1_01,"t",4), iVar3 == 0)) ||
           ((iVar3 = strncasecmp((char *)__s1_01,"T",4), iVar3 == 0 ||
            (lVar5 = strtol((char *)__s1_01,(char **)0x0,4), lVar5 == 1)))) {
          bVar2 = true;
LAB_00345d24:
          bVar2 = setBoolParam(this,(BoolParam)lVar9,bVar2,true);
          if (bVar2) {
            return true;
          }
        }
        else {
          iVar3 = strncasecmp((char *)__s1_01,"false",5);
          if (((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"FALSE",5), iVar3 == 0)) ||
             ((iVar3 = strncasecmp((char *)__s1_01,"f",5), iVar3 == 0 ||
              ((iVar3 = strncasecmp((char *)__s1_01,"F",5), iVar3 == 0 ||
               (lVar5 = strtol((char *)__s1_01,(char **)0x0,5), lVar5 == 0)))))) {
            bVar2 = false;
            goto LAB_00345d24;
          }
        }
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
        pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
        pcVar10 = "> for bool parameter <";
        goto LAB_00345f8a;
      }
      lVar9 = lVar9 + 1;
      puVar14 = puVar14 + 4;
    } while (lVar9 != 0x1a);
LAB_00345c61:
    VVar15 = (this->spxout).m_verbosity;
    if ((int)VVar15 < 3) {
      return false;
    }
    pSVar4 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar10 = "Error parsing settings file: unknown parameter name <";
  }
  else {
    if (((*__s1 == 0x69) && (*pbVar13 == 0x6e)) && (pbVar13[1] == 0x74)) {
      puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::intParam;
      lVar9 = 0;
      do {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
        if (iVar3 == 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          sVar7 = strlen((char *)__s1_01);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,__s1_01,__s1_01 + sVar7);
          iVar3 = std::__cxx11::stoi(&local_58,(size_t *)0x0,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          bVar2 = setIntParam(this,(IntParam)lVar9,iVar3,false);
          if (bVar2) {
            return true;
          }
          VVar15 = (this->spxout).m_verbosity;
          if ((int)VVar15 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
          pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
          pcVar10 = "> for int parameter <";
          goto LAB_00345f8a;
        }
        lVar9 = lVar9 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar9 != 0x1c);
      goto LAB_00345c61;
    }
    iVar3 = strncmp((char *)__s1,"real",4);
    if (iVar3 == 0) {
      puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::realParam;
      lVar9 = 0;
      do {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
        if (iVar3 == 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          sVar7 = strlen((char *)__s1_01);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,__s1_01,__s1_01 + sVar7);
          value = std::__cxx11::stod(&local_58,(size_t *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            local_38 = value;
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            value = local_38;
          }
          bVar2 = setRealParam(this,(RealParam)lVar9,value,true);
          if (bVar2) {
            return true;
          }
          VVar15 = (this->spxout).m_verbosity;
          if ((int)VVar15 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar4 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
          pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_01);
          pcVar10 = "> for R parameter <";
LAB_00345f8a:
          pSVar4 = soplex::operator<<(pSVar4,pcVar10);
          pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_00);
          pSVar4 = soplex::operator<<(pSVar4,"> in line ");
          std::ostream::operator<<((ostream *)pSVar4->m_streams[pSVar4->m_verbosity],lineNumber);
          soplex::operator<<(pSVar4,".\n");
          (this->spxout).m_verbosity = VVar15;
          return false;
        }
        lVar9 = lVar9 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar9 != 0x1b);
      goto LAB_00345c61;
    }
    iVar3 = strncmp((char *)__s1,"uint",4);
    if (iVar3 == 0) {
      iVar3 = strncmp((char *)__s1_00,"random_seed",0xb);
      if (iVar3 == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        sVar7 = strlen((char *)__s1_01);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s1_01,__s1_01 + sVar7)
        ;
        uVar6 = std::__cxx11::stoul(&local_58,(size_t *)0x0,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (uVar6 >> 0x20 != 0) {
          VVar15 = (this->spxout).m_verbosity;
          uVar6 = 0xffffffff;
          if (0 < (int)VVar15) {
            (this->spxout).m_verbosity = WARNING;
            soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n");
            (this->spxout).m_verbosity = VVar15;
          }
        }
        setRandomSeed(this,(uint)uVar6);
        return true;
      }
      VVar15 = (this->spxout).m_verbosity;
      if ((int)VVar15 < 3) {
        return false;
      }
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(&this->spxout,
                         "Error parsing settings file for uint parameter <random_seed>.\n");
      (this->spxout).m_verbosity = VVar15;
      return false;
    }
    VVar15 = (this->spxout).m_verbosity;
    if ((int)VVar15 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar4 = soplex::operator<<(&this->spxout,
                                "Error parsing settings file: invalid parameter type <");
    pSVar4 = soplex::operator<<(pSVar4,(char *)__s1);
    pcVar10 = "> for parameter <";
  }
  pSVar4 = soplex::operator<<(pSVar4,pcVar10);
  pSVar4 = soplex::operator<<(pSVar4,(char *)__s1_00);
  pcVar10 = "> in line ";
  goto LAB_00345a39;
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_003458a0:
    __s1_00 = pbVar16 + 1;
    bVar1 = *pbVar16;
    pbVar16 = __s1_00;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3a) goto LAB_003458f8;
        break;
      }
      goto LAB_003458a0;
    }
  }
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  (this->spxout).m_verbosity = INFO1;
  poVar11 = (this->spxout).m_streams[3];
  pcVar10 = "Error parsing settings file: no \':\' separating parameter type and name in line ";
  lVar9 = 0x4f;
LAB_00345941:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar9);
  std::ostream::operator<<
            ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],lineNumber);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->spxout).m_streams[(this->spxout).m_verbosity],".\n",2);
  (this->spxout).m_verbosity = VVar15;
  return false;
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_003459ae:
    __s1_01 = pbVar16 + 1;
    bVar1 = *pbVar16;
    pbVar16 = __s1_01;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3d) goto LAB_003459f9;
        break;
      }
      goto LAB_003459ae;
    }
  }
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  pSVar4 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar10 = "Error parsing settings file: no \'=\' after parameter name in line ";
LAB_00345a39:
  pSVar4 = soplex::operator<<(pSVar4,pcVar10);
  std::ostream::operator<<((ostream *)pSVar4->m_streams[pSVar4->m_verbosity],lineNumber);
  soplex::operator<<(pSVar4,".\n");
  (this->spxout).m_verbosity = VVar15;
  return false;
}

Assistant:

bool SoPlexBase<R>::_parseSettingsLine(char* line, const int lineNumber)
{
   assert(line != nullptr);

   bool success = true;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing settings file: no ':' separating parameter type and name in line " << lineNumber <<
                       ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter name in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no '=' after parameter name in line "
                       << lineNumber << ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter value in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: additional character '" << *line <<
                       "' after parameter value in line " << lineNumber << ".\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a R parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;

#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for R parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << "> in line " << lineNumber << ".\n");

   return false;
}